

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O0

void __thiscall
btDbvtBroadphase::btDbvtBroadphase(btDbvtBroadphase *this,btOverlappingPairCache *paircache)

{
  _func_int **in_RSI;
  btBroadphaseInterface *in_RDI;
  int i;
  int in_stack_ffffffffffffff8c;
  size_t in_stack_ffffffffffffff90;
  btDbvt *in_stack_ffffffffffffffa0;
  btHashedOverlappingPairCache *in_stack_ffffffffffffffb0;
  btBroadphaseInterface *local_28;
  int local_20;
  
  btBroadphaseInterface::btBroadphaseInterface(in_RDI);
  in_RDI->_vptr_btBroadphaseInterface = (_func_int **)&PTR__btDbvtBroadphase_002e1d60;
  local_28 = in_RDI + 1;
  do {
    btDbvt::btDbvt(in_stack_ffffffffffffffa0);
    local_28 = local_28 + 0xc;
  } while (local_28 != in_RDI + 0x19);
  *(undefined1 *)((long)&in_RDI[0x23]._vptr_btBroadphaseInterface + 5) = 0;
  *(undefined1 *)((long)&in_RDI[0x23]._vptr_btBroadphaseInterface + 6) = 1;
  *(byte *)((long)&in_RDI[0x23]._vptr_btBroadphaseInterface + 4) =
       -(in_RSI == (_func_int **)0x0) & 1;
  *(undefined4 *)&in_RDI[0x1d]._vptr_btBroadphaseInterface = 0;
  *(undefined4 *)((long)&in_RDI[0x1d]._vptr_btBroadphaseInterface + 4) = 0;
  *(undefined4 *)&in_RDI[0x20]._vptr_btBroadphaseInterface = 0;
  *(undefined4 *)&in_RDI[0x1e]._vptr_btBroadphaseInterface = 1;
  *(undefined4 *)((long)&in_RDI[0x1e]._vptr_btBroadphaseInterface + 4) = 0;
  *(undefined4 *)&in_RDI[0x1f]._vptr_btBroadphaseInterface = 10;
  *(undefined4 *)((long)&in_RDI[0x1f]._vptr_btBroadphaseInterface + 4) = 1;
  *(undefined4 *)((long)&in_RDI[0x20]._vptr_btBroadphaseInterface + 4) = 0;
  *(undefined4 *)&in_RDI[0x21]._vptr_btBroadphaseInterface = 0;
  *(undefined4 *)((long)&in_RDI[0x21]._vptr_btBroadphaseInterface + 4) = 0;
  if (in_RSI == (_func_int **)0x0) {
    in_RSI = (_func_int **)
             btAlignedAllocInternal(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    btHashedOverlappingPairCache::btHashedOverlappingPairCache(in_stack_ffffffffffffffb0);
  }
  in_RDI[0x1c]._vptr_btBroadphaseInterface = in_RSI;
  *(undefined4 *)&in_RDI[0x23]._vptr_btBroadphaseInterface = 0;
  *(undefined4 *)&in_RDI[0x22]._vptr_btBroadphaseInterface = 0;
  *(undefined4 *)((long)&in_RDI[0x22]._vptr_btBroadphaseInterface + 4) = 0;
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    in_RDI[(long)local_20 + 0x19]._vptr_btBroadphaseInterface = (_func_int **)0x0;
  }
  return;
}

Assistant:

btDbvtBroadphase::btDbvtBroadphase(btOverlappingPairCache* paircache)
{
	m_deferedcollide	=	false;
	m_needcleanup		=	true;
	m_releasepaircache	=	(paircache!=0)?false:true;
	m_prediction		=	0;
	m_stageCurrent		=	0;
	m_fixedleft			=	0;
	m_fupdates			=	1;
	m_dupdates			=	0;
	m_cupdates			=	10;
	m_newpairs			=	1;
	m_updates_call		=	0;
	m_updates_done		=	0;
	m_updates_ratio		=	0;
	m_paircache			=	paircache? paircache	: new(btAlignedAlloc(sizeof(btHashedOverlappingPairCache),16)) btHashedOverlappingPairCache();
	m_gid				=	0;
	m_pid				=	0;
	m_cid				=	0;
	for(int i=0;i<=STAGECOUNT;++i)
	{
		m_stageRoots[i]=0;
	}
#if DBVT_BP_PROFILE
	clear(m_profiling);
#endif
}